

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O0

int regex_match(regex_t *r,char *to_match,basic_matchlist_t *match_list)

{
  int iVar1;
  int finish_00;
  char *matched_text_00;
  regmatch_t local_a8;
  regmatch_t m [10];
  char *matched_text;
  int finish;
  int start;
  int nomatch;
  int i;
  char *pcStack_28;
  int n_matches;
  char *p;
  basic_matchlist_t *match_list_local;
  char *to_match_local;
  regex_t *r_local;
  
  pcStack_28 = to_match;
  while (iVar1 = regexec((regex_t *)r,pcStack_28,10,&local_a8,0), iVar1 == 0) {
    if (local_a8.rm_so != -1) {
      iVar1 = local_a8.rm_so + ((int)pcStack_28 - (int)to_match);
      finish_00 = local_a8.rm_eo + ((int)pcStack_28 - (int)to_match);
      matched_text_00 = strndup(to_match + iVar1,(long)(finish_00 - iVar1));
      basic_matchlist_add(match_list,iVar1,finish_00,matched_text_00);
    }
    pcStack_28 = pcStack_28 + local_a8.rm_eo;
  }
  return iVar1;
}

Assistant:

int regex_match (regex_t * r, const char * to_match, basic_matchlist_t *match_list)
{
    const char * p = to_match;
    const int n_matches = 10;
    regmatch_t m[n_matches];

    while (1)
    {
        int i = 0;
        int nomatch = regexec (r, p, n_matches, m, 0);
        if (nomatch)
        {
            //printf ("No more matches.\n");
            return nomatch;
        }
        //printf("nomatch = %d\n", nomatch);
        for (i = 0; i < n_matches; i++)
        {
            int start;
            int finish;
            if (m[i].rm_so == -1)
            {
                break;
            }

            start = m[i].rm_so + (p - to_match);
            finish = m[i].rm_eo + (p - to_match);
            char* matched_text = strndup(to_match+start, finish-start);
            //printf("Match %d at %d, %d\n", i, m[i].rm_so, m[i].rm_eo);
            basic_matchlist_add(match_list, start, finish, matched_text);
            break;
        }

        p += m[0].rm_eo;
    }
    return 0;
}